

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O2

bool __thiscall
glslang::TIntermediate::parseConstTree
          (TIntermediate *this,TIntermNode *root,TConstUnionArray *unionArray,
          TOperator constructorType,TType *t,bool singleConstantParam)

{
  TConstTraverser it;
  TConstTraverser TStack_88;
  
  if (root != (TIntermNode *)0x0) {
    TConstTraverser::TConstTraverser(&TStack_88,unionArray,singleConstantParam,constructorType,t);
    (*root->_vptr_TIntermNode[2])(root,&TStack_88);
    return TStack_88.error;
  }
  return false;
}

Assistant:

bool TIntermediate::parseConstTree(TIntermNode* root, TConstUnionArray unionArray, TOperator constructorType, const TType& t, bool singleConstantParam)
{
    if (root == nullptr)
        return false;

    TConstTraverser it(unionArray, singleConstantParam, constructorType, t);

    root->traverse(&it);
    if (it.error)
        return true;
    else
        return false;
}